

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

ProgramNode * __thiscall
Parser::ProgramList(Parser *this,FunctionListNode *functions,TypeDeclNode *typelist,
                   VarDeclNode *varlist)

{
  uint uVar1;
  ProgramNode *pPVar2;
  
  if (this->tok != 0) {
    pPVar2 = Program(this,functions,typelist,varlist);
    return pPVar2;
  }
  Eat(this,0);
  pPVar2 = (ProgramNode *)operator_new(0x28);
  ProgramNode::ProgramNode(pPVar2,functions,typelist,varlist);
  uVar1 = lexical_analyzer_getLine();
  (*(pPVar2->super_ASTNode)._vptr_ASTNode[2])(pPVar2,(ulong)uVar1);
  return pPVar2;
}

Assistant:

ProgramNode *Parser::ProgramList(FunctionListNode *functions, TypeDeclNode *typelist, VarDeclNode *varlist)
{

    switch (tok) {
        case ENDOFFILE: {
            Eat(ENDOFFILE);

            ProgramNode *programNode = new ProgramNode(functions, typelist, varlist);
            programNode->setLine(lexical_analyzer_getLine());

            return programNode;
        }
        default: {
            return Program(functions, typelist, varlist);
        }
    }
}